

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Value.cpp
# Opt level: O0

Value * soul::Value::createStringLiteral(Value *__return_storage_ptr__,Handle h)

{
  PackedData local_58;
  Type local_30;
  undefined1 local_15;
  Handle local_14;
  Value *pVStack_10;
  Handle h_local;
  Value *v;
  
  local_15 = 0;
  local_14.handle = h.handle;
  pVStack_10 = __return_storage_ptr__;
  Type::createStringLiteral();
  Value(__return_storage_ptr__,&local_30);
  Type::~Type(&local_30);
  getData(&local_58,__return_storage_ptr__);
  PackedData::setAs<choc::value::StringDictionary::Handle>(&local_58,local_14);
  return __return_storage_ptr__;
}

Assistant:

Value Value::createStringLiteral (StringDictionary::Handle h)
{
    Value v (Type::createStringLiteral());
    v.getData().setAs (h);
    return v;
}